

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_traits.hpp
# Opt level: O0

void jsoncons::encode_traits<std::pair<int,int>,char,void>::
     encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (value_type *val,basic_json_visitor<char> *encoder,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *proto,
               error_code *ec)

{
  bool bVar1;
  error_code *in_RCX;
  basic_json_visitor<char> *in_RSI;
  ser_context *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  semantic_tag tag;
  size_t in_stack_ffffffffffffffa8;
  basic_json_visitor<char> *this;
  ser_context local_40;
  error_code *in_stack_ffffffffffffffc8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  ser_context encoder_00;
  
  tag = (semantic_tag)((ulong)in_stack_ffffffffffffffa0 >> 0x38);
  encoder_00._vptr_ser_context = (_func_int **)0x0;
  this = in_RSI;
  ser_context::ser_context((ser_context *)&stack0xffffffffffffffd8);
  basic_json_visitor<char>::begin_array
            (this,in_stack_ffffffffffffffa8,tag,in_stack_ffffffffffffff98,(error_code *)0x28eab5);
  ser_context::~ser_context((ser_context *)&stack0xffffffffffffffd8);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if (!bVar1) {
    encode_traits<int,char,void>::
    encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
              (&in_RCX->_M_value,(basic_json_visitor<char> *)encoder_00._vptr_ser_context,
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
    if (!bVar1) {
      encode_traits<int,char,void>::
      encode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                (&in_RCX->_M_value,(basic_json_visitor<char> *)encoder_00._vptr_ser_context,
                 in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
      if (!bVar1) {
        local_40._vptr_ser_context = (_func_int **)0x0;
        ser_context::ser_context(&local_40);
        basic_json_visitor<char>::end_array(in_RSI,in_stack_ffffffffffffff98,(error_code *)0x28eb8f)
        ;
        ser_context::~ser_context(&local_40);
      }
    }
  }
  return;
}

Assistant:

static void encode(const value_type& val, 
                           basic_json_visitor<CharT>& encoder, 
                           const Json& proto, 
                           std::error_code& ec)
        {
            encoder.begin_array(2,semantic_tag::none,ser_context(),ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T1,CharT>::encode(val.first, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encode_traits<T2,CharT>::encode(val.second, encoder, proto, ec);
            if (JSONCONS_UNLIKELY(ec)) {return;}
            encoder.end_array(ser_context(),ec);
        }